

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<const_fasttext::DenseMatrix> __thiscall
fasttext::FastText::getOutputMatrix(FastText *this)

{
  element_type *peVar1;
  runtime_error *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<fasttext::Matrix> *in_RSI;
  element_type *in_RDI;
  shared_ptr<const_fasttext::DenseMatrix> sVar3;
  shared_ptr<fasttext::DenseMatrix> *in_stack_ffffffffffffffa8;
  shared_ptr<const_fasttext::DenseMatrix> *in_stack_ffffffffffffffb0;
  
  if (((ulong)in_RSI[6].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi & 1) != 0) {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18ee75);
    if ((peVar1->qout & 1U) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t export quantized matrix");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  peVar2 = std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::get
                     (&in_RSI[3].super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 != (element_type *)0x0) {
    std::dynamic_pointer_cast<fasttext::DenseMatrix,fasttext::Matrix>(in_RSI);
    std::shared_ptr<fasttext::DenseMatrix_const>::shared_ptr<fasttext::DenseMatrix,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr
              ((shared_ptr<fasttext::DenseMatrix> *)0x18ef34);
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         in_RDI;
    return (shared_ptr<const_fasttext::DenseMatrix>)
           sVar3.super___shared_ptr<const_fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("output_.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/fasttext.cc"
                ,0x5a,
                "std::shared_ptr<const DenseMatrix> fasttext::FastText::getOutputMatrix() const");
}

Assistant:

std::shared_ptr<const DenseMatrix> FastText::getOutputMatrix() const {
  if (quant_ && args_->qout) {
    throw std::runtime_error("Can't export quantized matrix");
  }
  assert(output_.get());
  return std::dynamic_pointer_cast<DenseMatrix>(output_);
}